

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

Vec_Wec_t * Abc_GiaSynthesize(Vec_Ptr_t *vGias,Gia_Man_t *pMulti)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Frame_t *pAVar3;
  Vec_Wec_t *p;
  Abc_Obj_t *pAVar4;
  Vec_Int_t *pVVar5;
  int i;
  int iVar6;
  long lVar7;
  
  pAVar2 = Abc_NtkCreateFromGias("top",vGias,pMulti);
  pAVar3 = Abc_FrameReadGlobalFrame();
  Abc_FrameReplaceCurrentNetwork(pAVar3,pAVar2);
  pAVar3 = Abc_FrameGetGlobalFrame();
  Cmd_CommandExecute(pAVar3,
                     "compress2rs; dch; map -a;  strash; compress2rs; dch; map -a;  strash; compress2rs; dch; map -a"
                    );
  pAVar3 = Abc_FrameReadGlobalFrame();
  pAVar2 = Abc_FrameReadNtk(pAVar3);
  p = Vec_WecStart(pAVar2->nObjCounts[7] + pAVar2->vPis->nSize + pAVar2->vPos->nSize);
  for (i = 0; i < pAVar2->vPis->nSize; i = i + 1) {
    pAVar4 = Abc_NtkPi(pAVar2,i);
    (pAVar4->field_6).iTemp = i;
  }
  for (iVar6 = 0; iVar6 < pAVar2->vObjs->nSize; iVar6 = iVar6 + 1) {
    pAVar4 = Abc_NtkObj(pAVar2,iVar6);
    if ((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7)) {
      pVVar5 = Vec_WecEntry(p,i);
      iVar1 = Abc_GateToType(pAVar4);
      Vec_IntPush(pVVar5,iVar1);
      Vec_IntPush(pVVar5,i);
      for (lVar7 = 0; lVar7 < (pAVar4->vFanins).nSize; lVar7 = lVar7 + 1) {
        Vec_IntPush(pVVar5,*(int *)((long)pAVar4->pNtk->vObjs->pArray
                                          [(pAVar4->vFanins).pArray[lVar7]] + 0x40));
      }
      (pAVar4->field_6).iTemp = i;
      i = i + 1;
    }
  }
  for (iVar6 = 0; iVar6 < pAVar2->vPos->nSize; iVar6 = iVar6 + 1) {
    pAVar4 = Abc_NtkPo(pAVar2,iVar6);
    pVVar5 = Vec_WecEntry(p,i + iVar6);
    iVar1 = *(pAVar4->vFanins).pArray;
    Vec_IntPushTwo(pVVar5,*(int *)((long)pAVar4->pNtk->vObjs->pArray[iVar1] + 0x40),iVar1);
  }
  if ((i - p->nSize) + iVar6 == 0) {
    return p;
  }
  __assert_fail("Vec_WecSize(vRes) == iNode",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                ,0xc61,"Vec_Wec_t *Abc_GiaSynthesize(Vec_Ptr_t *, Gia_Man_t *)");
}

Assistant:

Vec_Wec_t * Abc_GiaSynthesize( Vec_Ptr_t * vGias, Gia_Man_t * pMulti )
{
    Vec_Wec_t * vRes = NULL;
    Abc_Ntk_t * pNtk = Abc_NtkCreateFromGias( "top", vGias, pMulti );
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, iNode = 0;
    Abc_FrameReplaceCurrentNetwork( Abc_FrameReadGlobalFrame(), pNtk );
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "compress2rs; dch; map -a;  strash; compress2rs; dch; map -a;  strash; compress2rs; dch; map -a" );
    pNtkNew = Abc_FrameReadNtk( Abc_FrameReadGlobalFrame() );
    vRes = Vec_WecStart( Abc_NtkPiNum(pNtkNew) + Abc_NtkNodeNum(pNtkNew) + Abc_NtkPoNum(pNtkNew) );
    Abc_NtkForEachPi( pNtkNew, pObj, i )
        pObj->iTemp = iNode++;
    Abc_NtkForEachNode( pNtkNew, pObj, i )
    {
        Vec_Int_t * vNode = Vec_WecEntry(vRes, iNode);
        Vec_IntPush( vNode, Abc_GateToType(pObj) );
        Vec_IntPush( vNode, iNode );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vNode, pFanin->iTemp );
        pObj->iTemp = iNode++;
    }
    Abc_NtkForEachPo( pNtkNew, pObj, i )
        Vec_IntPushTwo( Vec_WecEntry(vRes, iNode++), ABC_OPER_BIT_BUF, Abc_ObjFanin0(pObj)->iTemp );
    assert( Vec_WecSize(vRes) == iNode );
    return vRes;
}